

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall
ON_Viewport::GetSphereDepth
          (ON_Viewport *this,ON_Sphere *sphere,double *near_dist,double *far_dist,bool bGrowNearFar)

{
  ON_3dPoint point;
  bool bVar1;
  double dVar2;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  ON_Sphere::Center(sphere);
  point.y = (double)uStack_40;
  point.x = (double)local_48;
  point.z = local_38;
  bVar1 = GetPointDepth(this,point,near_dist,far_dist,bGrowNearFar);
  if (bVar1) {
    dVar2 = ON_Sphere::Radius(sphere);
    if (0.0 < dVar2) {
      if (near_dist != (double *)0x0) {
        dVar2 = ON_Sphere::Radius(sphere);
        *near_dist = *near_dist - dVar2;
      }
      if (far_dist != (double *)0x0) {
        dVar2 = ON_Sphere::Radius(sphere);
        *far_dist = dVar2 + *far_dist;
      }
    }
  }
  return bVar1;
}

Assistant:

bool ON_Viewport::GetSphereDepth( 
       ON_Sphere sphere,
       double* near_dist,
       double* far_dist,
       bool bGrowNearFar
       ) const
{
  bool rc = GetPointDepth( sphere.Center(), near_dist, far_dist, bGrowNearFar );
  if ( rc && sphere.Radius() > 0.0 )
  {
    if ( 0 != near_dist )
      *near_dist -= sphere.Radius();
    if ( 0 != far_dist )
      *far_dist += sphere.Radius();
  }
  return rc;
}